

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O0

void __thiscall
checker_texture::checker_texture
          (checker_texture *this,shared_ptr<texture> *t0,shared_ptr<texture> *t1)

{
  shared_ptr<texture> *t1_local;
  shared_ptr<texture> *t0_local;
  checker_texture *this_local;
  
  texture::texture(&this->super_texture);
  (this->super_texture)._vptr_texture = (_func_int **)&PTR_value_001606e0;
  std::shared_ptr<texture>::shared_ptr(&this->odd,t0);
  std::shared_ptr<texture>::shared_ptr(&this->even,t1);
  return;
}

Assistant:

checker_texture(shared_ptr<texture> t0, shared_ptr<texture> t1) : odd(t0), even(t1) {}